

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaYca.cpp
# Opt level: O1

void Imf_3_2::RgbaYca::RGBAtoYCA(V3f *yw,int n,bool aIsValid,Rgba *rgbaIn,Rgba *ycaOut)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Rgba RVar5;
  char cVar6;
  long lVar7;
  half hVar8;
  ushort uVar9;
  uint uVar10;
  ulong uVar11;
  half hVar12;
  float fVar13;
  uint uVar14;
  Rgba RVar15;
  ulong uVar16;
  float fVar17;
  float fVar18;
  
  lVar7 = _imath_half_to_float_table;
  if (0 < n) {
    fVar2 = yw->x;
    fVar3 = yw->y;
    fVar4 = yw->z;
    uVar11 = 0;
    do {
      RVar5 = rgbaIn[uVar11];
      if (((~RVar5._0_4_ & 0x7c00) == 0) ||
         (pfVar1 = (float *)(lVar7 + ((ulong)RVar5 & 0xffff) * 4), RVar15 = RVar5,
         *pfVar1 <= 0.0 && *pfVar1 != 0.0)) {
        RVar15.r._h = 0;
        RVar15.g._h = 0;
        RVar15.b._h = 0;
        RVar15.a._h = 0;
      }
      hVar8 = RVar5.g._h;
      if (((~RVar5._2_4_ & 0x7c00) == 0) ||
         (pfVar1 = (float *)(lVar7 + ((ulong)RVar5 >> 0x10 & 0xffff) * 4),
         *pfVar1 <= 0.0 && *pfVar1 != 0.0)) {
        hVar8._h = 0;
      }
      hVar12 = RVar5.b._h;
      if (((~RVar5._4_4_ & 0x7c00) == 0) ||
         (pfVar1 = (float *)(lVar7 + ((ulong)RVar5 >> 0x20 & 0xffff) * 4),
         *pfVar1 <= 0.0 && *pfVar1 != 0.0)) {
        hVar12._h = 0;
      }
      fVar13 = *(float *)(lVar7 + ((ulong)RVar15 & 0xffff) * 4);
      fVar18 = *(float *)(lVar7 + (ulong)hVar8._h * 4);
      uVar16 = (ulong)hVar12._h;
      if (((fVar13 != fVar18) || (pfVar1 = (float *)(lVar7 + uVar16 * 4), fVar18 != *pfVar1)) ||
         (NAN(fVar18) || NAN(*pfVar1))) {
        fVar18 = *(float *)(lVar7 + uVar16 * 4) * fVar4 + fVar13 * fVar2 + fVar18 * fVar3;
        fVar13 = ABS(fVar18);
        uVar10 = (uint)fVar18 >> 0x10 & 0x8000;
        if ((uint)fVar13 < 0x38800000) {
          if ((0x33000000 < (uint)fVar13) &&
             (uVar14 = (uint)fVar13 & 0x7fffff | 0x800000, cVar6 = (char)((uint)fVar13 >> 0x17),
             uVar10 = uVar10 | uVar14 >> (0x7eU - cVar6 & 0x1f),
             0x80000000 < uVar14 << (cVar6 + 0xa2U & 0x1f))) {
            uVar10 = uVar10 + 1;
          }
        }
        else if ((uint)fVar13 < 0x7f800000) {
          if ((uint)fVar13 < 0x477ff000) {
            uVar10 = (int)fVar13 + 0x8000fff + (uint)(((uint)fVar13 >> 0xd & 1) != 0) >> 0xd |
                     uVar10;
          }
          else {
            uVar10 = uVar10 | 0x7c00;
          }
        }
        else {
          uVar10 = uVar10 | 0x7c00;
          if (fVar13 != INFINITY) {
            uVar14 = (uint)fVar13 >> 0xd & 0x3ff;
            uVar10 = uVar10 | uVar14 | (uint)(uVar14 == 0);
          }
        }
        ycaOut[uVar11].g._h = (uint16_t)uVar10;
        fVar13 = *(float *)(lVar7 + (ulong)(uVar10 & 0xffff) * 4);
        fVar18 = *(float *)(lVar7 + ((ulong)RVar15 & 0xffff) * 4) - fVar13;
        if (fVar13 * 65504.0 <= ABS(fVar18)) {
          uVar9 = 0;
        }
        else {
          fVar18 = fVar18 / fVar13;
          fVar17 = ABS(fVar18);
          uVar9 = (ushort)((uint)fVar18 >> 0x10) & 0x8000;
          if ((uint)fVar17 < 0x38800000) {
            if ((0x33000000 < (uint)fVar17) &&
               (uVar10 = (uint)fVar17 & 0x7fffff | 0x800000, cVar6 = (char)((uint)fVar17 >> 0x17),
               uVar9 = uVar9 | (ushort)(uVar10 >> (0x7eU - cVar6 & 0x1f)),
               0x80000000 < uVar10 << (cVar6 + 0xa2U & 0x1f))) {
              uVar9 = uVar9 + 1;
            }
          }
          else if ((uint)fVar17 < 0x7f800000) {
            if ((uint)fVar17 < 0x477ff000) {
              uVar9 = (ushort)((int)fVar17 + 0x8000fff + (uint)(((uint)fVar17 >> 0xd & 1) != 0) >>
                              0xd) | uVar9;
            }
            else {
              uVar9 = uVar9 | 0x7c00;
            }
          }
          else {
            uVar9 = uVar9 | 0x7c00;
            if (fVar17 != INFINITY) {
              uVar10 = (uint)fVar17 >> 0xd & 0x3ff;
              uVar9 = uVar9 | (ushort)uVar10 | (ushort)(uVar10 == 0);
            }
          }
        }
        ycaOut[uVar11].r._h = uVar9;
        fVar18 = *(float *)(lVar7 + uVar16 * 4) - fVar13;
        if (fVar13 * 65504.0 <= ABS(fVar18)) {
          ycaOut[uVar11].b._h = 0;
        }
        else {
          fVar18 = fVar18 / fVar13;
          fVar13 = ABS(fVar18);
          uVar9 = (ushort)((uint)fVar18 >> 0x10) & 0x8000;
          if ((uint)fVar13 < 0x38800000) {
            if ((0x33000000 < (uint)fVar13) &&
               (cVar6 = (char)((uint)fVar13 >> 0x17), uVar10 = (uint)fVar13 & 0x7fffff | 0x800000,
               uVar9 = uVar9 | (ushort)(uVar10 >> (0x7eU - cVar6 & 0x1f)),
               0x80000000 < uVar10 << (cVar6 + 0xa2U & 0x1f))) {
              uVar9 = uVar9 + 1;
            }
          }
          else if ((uint)fVar13 < 0x7f800000) {
            if ((uint)fVar13 < 0x477ff000) {
              uVar9 = (ushort)((int)fVar13 + 0x8000fff + (uint)(((uint)fVar13 >> 0xd & 1) != 0) >>
                              0xd) | uVar9;
            }
            else {
              uVar9 = uVar9 | 0x7c00;
            }
          }
          else {
            uVar9 = uVar9 | 0x7c00;
            if (fVar13 != INFINITY) {
              uVar10 = (uint)fVar13 >> 0xd & 0x3ff;
              uVar9 = uVar9 | (ushort)uVar10 | (ushort)(uVar10 == 0);
            }
          }
          ycaOut[uVar11].b._h = uVar9;
        }
      }
      else {
        ycaOut[uVar11].r._h = 0;
        ycaOut[uVar11].g._h = hVar8._h;
        ycaOut[uVar11].b._h = 0;
      }
      hVar8 = RVar5.a._h;
      if (!aIsValid) {
        hVar8._h = 0x3c00;
      }
      ycaOut[uVar11].a._h = hVar8._h;
      uVar11 = uVar11 + 1;
    } while ((uint)n != uVar11);
  }
  return;
}

Assistant:

void
RGBAtoYCA (
    const V3f& yw,
    int        n,
    bool       aIsValid,
    const Rgba rgbaIn[/*n*/],
    Rgba       ycaOut[/*n*/])
{
    for (int i = 0; i < n; ++i)
    {
        Rgba  in  = rgbaIn[i];
        Rgba& out = ycaOut[i];

        //
        // Conversion to YCA and subsequent chroma subsampling
        // work only if R, G and B are finite and non-negative.
        //

        if (!in.r.isFinite () || in.r < 0) in.r = 0;

        if (!in.g.isFinite () || in.g < 0) in.g = 0;

        if (!in.b.isFinite () || in.b < 0) in.b = 0;

        if (in.r == in.g && in.g == in.b)
        {
            //
            // Special case -- R, G and B are equal. To avoid rounding
            // errors, we explicitly set the output luminance channel
            // to G, and the chroma channels to 0.
            //
            // The special cases here and in YCAtoRGBA() ensure that
            // converting black-and white images from RGBA to YCA and
            // back is lossless.
            //

            out.r = 0;
            out.g = in.g;
            out.b = 0;
        }
        else
        {
            out.g = in.r * yw.x + in.g * yw.y + in.b * yw.z;

            float Y = out.g;

            if (abs (in.r - Y) < HALF_MAX * Y)
                out.r = (in.r - Y) / Y;
            else
                out.r = 0;

            if (abs (in.b - Y) < HALF_MAX * Y)
                out.b = (in.b - Y) / Y;
            else
                out.b = 0;
        }

        if (aIsValid)
            out.a = in.a;
        else
            out.a = 1;
    }
}